

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O0

int Disasm(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  iVar1 = InitVariables(pMyDisasm);
  if (iVar1 == 0) {
    pMyDisasm_local._4_4_ = -1;
  }
  else {
    AnalyzeOpcode(pMyDisasm);
    pMyDisasm->Error = (pMyDisasm->Reserved_).ERROR_OPCODE;
    if ((pMyDisasm->Reserved_).OutOfBlock == 0) {
      if ((pMyDisasm->Reserved_).ERROR_OPCODE == -1) {
        BuildCompleteInstruction(pMyDisasm);
        pMyDisasm_local._4_4_ = -1;
      }
      else {
        FixOpSizeForMemoryOperand(pMyDisasm);
        FixREXPrefixes(pMyDisasm);
        FillSegmentsRegisters(pMyDisasm);
        CompleteInstructionFields(pMyDisasm);
        BuildCompleteInstruction(pMyDisasm);
        pMyDisasm_local._4_4_ = (int)(pMyDisasm->Reserved_).EIP_ - (int)pMyDisasm->EIP;
      }
    }
    else {
      pMyDisasm->Error = -2;
      pMyDisasm_local._4_4_ = -2;
    }
  }
  return pMyDisasm_local._4_4_;
}

Assistant:

int __bea_callspec__ Disasm (PDISASM pMyDisasm)
{
  if (InitVariables(pMyDisasm)) {
    (void) AnalyzeOpcode(pMyDisasm);
    pMyDisasm->Error = GV.ERROR_OPCODE;
    if (!GV.OutOfBlock) {
      if (GV.ERROR_OPCODE == UNKNOWN_OPCODE) {
        #ifndef BEA_LIGHT_DISASSEMBLY
        BuildCompleteInstruction(pMyDisasm);
        #endif
        return UNKNOWN_OPCODE;
      }
      else {
        FixOpSizeForMemoryOperand(pMyDisasm);
        FixREXPrefixes(pMyDisasm);
        FillSegmentsRegisters(pMyDisasm);
        CompleteInstructionFields(pMyDisasm);
        #ifndef BEA_LIGHT_DISASSEMBLY
        BuildCompleteInstruction(pMyDisasm);
        #endif
        return (int) (GV.EIP_-pMyDisasm->EIP);
      }
    }
    else {
      pMyDisasm->Error = OUT_OF_BLOCK;
      return OUT_OF_BLOCK;
    }
  }
  else {
    return UNKNOWN_OPCODE;
  }
}